

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

BasicImageIO * __thiscall gimage::ImageIO::getBasicImageIO(ImageIO *this,char *name,bool reading)

{
  int iVar1;
  IOException *this_00;
  pointer ppBVar2;
  allocator local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ppBVar2 = (this->list).
            super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if ((this->list).
        super__Vector_base<gimage::BasicImageIO_*,_std::allocator<gimage::BasicImageIO_*>_>._M_impl.
        super__Vector_impl_data._M_finish <= ppBVar2) {
      this_00 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_80,name,&local_81);
      std::operator+(&local_60,"Unknown image type (",&local_80);
      std::operator+(&local_40,&local_60,")");
      gutil::IOException::IOException(this_00,&local_40);
      __cxa_throw(this_00,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
    iVar1 = (*(*ppBVar2)->_vptr_BasicImageIO[3])(*ppBVar2,name,(ulong)reading);
    if ((char)iVar1 != '\0') break;
    ppBVar2 = ppBVar2 + 1;
  }
  return *ppBVar2;
}

Assistant:

const BasicImageIO &ImageIO::getBasicImageIO(const char *name, bool reading) const
{
  for (std::vector<BasicImageIO *>::const_iterator it=list.begin(); it<list.end(); ++it)
  {
    if ((*it)->handlesFile(name, reading))
    {
      return **it;
    }
  }

  throw gutil::IOException("Unknown image type ("+std::string(name)+")");
}